

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegionsBuilder.cpp
# Opt level: O0

void __thiscall ThreadRegionsBuilder::clear(ThreadRegionsBuilder *this)

{
  bool bVar1;
  reference ppVar2;
  reference ppTVar3;
  long in_RDI;
  ThreadRegion *iterator_2;
  iterator __end1_2;
  iterator __begin1_2;
  set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *__range1_2;
  pair<Node_*const,_ThreadRegion_*> iterator_1;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
  *__range1_1;
  pair<Node_*const,_ThreadRegion_*> iterator;
  iterator __end1;
  iterator __begin1;
  unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
  *__range1;
  unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
  *in_stack_ffffffffffffff68;
  ThreadRegion *pTVar4;
  ThreadRegion *in_stack_ffffffffffffff70;
  _Self local_70;
  _Self local_68;
  long local_60;
  Node *local_58;
  ThreadRegion *local_50;
  _Node_iterator_base<std::pair<Node_*const,_ThreadRegion_*>,_false> local_48;
  _Node_iterator_base<std::pair<Node_*const,_ThreadRegion_*>,_false> local_40;
  long local_38;
  Node *local_30;
  ThreadRegion *local_28;
  _Node_iterator_base<std::pair<Node_*const,_ThreadRegion_*>,_false> local_20;
  _Node_iterator_base<std::pair<Node_*const,_ThreadRegion_*>,_false> local_18 [3];
  
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
       ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::__detail::operator!=(local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false>::
             operator*((_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false> *)
                       0x1ab050);
    local_30 = ppVar2->first;
    pTVar4 = ppVar2->second;
    local_28 = pTVar4;
    if (pTVar4 != (ThreadRegion *)0x0) {
      ThreadRegion::~ThreadRegion(in_stack_ffffffffffffff70);
      operator_delete(pTVar4,0xa0);
    }
    std::__detail::_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false>::operator++
              ((_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false> *)
               in_stack_ffffffffffffff70);
  }
  local_38 = in_RDI + 0x38;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
       ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false>::
             operator*((_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false> *)
                       0x1ab0e6);
    local_58 = ppVar2->first;
    in_stack_ffffffffffffff70 = ppVar2->second;
    local_50 = in_stack_ffffffffffffff70;
    if (in_stack_ffffffffffffff70 != (ThreadRegion *)0x0) {
      ThreadRegion::~ThreadRegion(in_stack_ffffffffffffff70);
      operator_delete(in_stack_ffffffffffffff70,0xa0);
    }
    std::__detail::_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false>::operator++
              ((_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false> *)
               in_stack_ffffffffffffff70);
  }
  clearComputingData((ThreadRegionsBuilder *)in_stack_ffffffffffffff70);
  local_60 = in_RDI + 0x70;
  local_68._M_node =
       (_Base_ptr)
       std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::begin
                 ((set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *
                  )in_stack_ffffffffffffff68);
  local_70._M_node =
       (_Base_ptr)
       std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::end
                 ((set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *
                  )in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    ppTVar3 = std::_Rb_tree_const_iterator<ThreadRegion_*>::operator*
                        ((_Rb_tree_const_iterator<ThreadRegion_*> *)0x1ab183);
    pTVar4 = *ppTVar3;
    if (pTVar4 != (ThreadRegion *)0x0) {
      ThreadRegion::~ThreadRegion(in_stack_ffffffffffffff70);
      operator_delete(pTVar4,0xa0);
    }
    std::_Rb_tree_const_iterator<ThreadRegion_*>::operator++
              ((_Rb_tree_const_iterator<ThreadRegion_*> *)in_stack_ffffffffffffff70);
  }
  std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::clear
            ((set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *)
             0x1ab1cd);
  return;
}

Assistant:

void ThreadRegionsBuilder::clear() {
    for (auto iterator : visitedNodeToRegionMap) {
        delete iterator.second;
    }

    for (auto iterator : examinedNodeToRegionMap) {
        delete iterator.second;
    }

    clearComputingData();

    for (auto *iterator : threadRegions_) {
        delete iterator;
    }

    threadRegions_.clear();
}